

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

int __thiscall Parse::returnStmt(Parse *this)

{
  KeyWordTable *pKVar1;
  DelimiterTable *pDVar2;
  int iVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  int iVar6;
  char *pcVar7;
  bool bVar8;
  key_type local_60;
  key_type local_40;
  
  if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
      super__Vector_impl_data._M_start[this->curIndex].type == KEYWORD) {
    pKVar1 = this->keyWordTable;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"return","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&(pKVar1->
                           super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).index,&local_40);
    bVar8 = *pmVar4 ==
            (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
            super__Vector_impl_data._M_start[this->curIndex].id;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar8 = false;
  }
  if (!bVar8) {
    return 0;
  }
  this->curIndex = this->curIndex + 1;
  iVar3 = expression(this);
  iVar6 = *(int *)(*(long *)&(this->st->symbolTable).
                             super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[this->curFun].
                             super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                             ._M_impl.super__Vector_impl_data + 0x20);
  if (iVar3 == 0) {
    if (iVar6 != 7) {
      pcVar7 = anon_var_dwarf_3406e;
      goto LAB_0010d7a7;
    }
    std::vector<QuadTuple,std::allocator<QuadTuple>>::
    emplace_back<char_const(&)[7],char_const(&)[3],char_const(&)[3],char_const(&)[3]>
              ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,(char (*) [7])"return",
               (char (*) [3])"__",(char (*) [3])"__",(char (*) [3])"__");
  }
  else {
    if (iVar6 == 7) {
      pcVar7 = anon_var_dwarf_3407a;
LAB_0010d7a7:
      poVar5 = std::operator<<((ostream *)&std::cout,pcVar7);
      iVar6 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
              super__Vector_impl_data._M_start[this->curIndex].line;
      goto LAB_0010d7c6;
    }
    std::vector<QuadTuple,std::allocator<QuadTuple>>::
    emplace_back<char_const(&)[7],std::__cxx11::string&,char_const(&)[3],char_const(&)[3]>
              ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,(char (*) [7])"return",
               &this->expName,(char (*) [3])"__",(char (*) [3])"__");
  }
  if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
      super__Vector_impl_data._M_start[this->curIndex].type == DELIMTER) {
    pDVar2 = this->delimiterTable;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,anon_var_dwarf_33e1e + 0x12,anon_var_dwarf_33e1e + 0x13);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&(pDVar2->
                           super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).index,&local_60);
    bVar8 = *pmVar4 ==
            (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
            super__Vector_impl_data._M_start[this->curIndex].id;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar8 = false;
  }
  if (bVar8) {
    this->curIndex = this->curIndex + 1;
    return 1;
  }
  std::operator<<((ostream *)&std::cout,
                  (string *)
                  &(this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                   super__Vector_impl_data._M_start[this->curIndex].name);
  poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_34094);
  iVar6 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
          super__Vector_impl_data._M_start[this->curIndex].line + -1;
LAB_0010d7c6:
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar6);
  poVar5 = std::operator<<(poVar5,anon_var_dwarf_33d22);
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(0);
}

Assistant:

int Parse::returnStmt() {
    if(tokenVec[curIndex].type == KEYWORD && keyWordTable.index["return"] == tokenVec[curIndex].id) {
        curIndex++;
        if(!expression()) {
            Type returnType = st.symbolTable[curFun][0].type;
            //cout << returnType << endl;
            if(returnType != Type::VOID) {
                cout << "函数类型需要返回值在第" << tokenVec[curIndex].line << "行" << endl;
                exit(0);
            }
            quadVec.emplace_back("return", "__", "__", "__");
        } else {
            Type returnType = st.symbolTable[curFun][0].type;
//            cout << returnType << endl;
            if(returnType == Type::VOID) {
                cout << "函数类型是void 不需要返回值在第" << tokenVec[curIndex].line << "行" << endl;
                exit(0);
            }
            //return语句四元式设计
            quadVec.emplace_back("return", expName, "__", "__");
        }
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[";"] == tokenVec[curIndex].id) {
            curIndex++;
        } else {
            cout << tokenVec[curIndex].name;
            cout<<"return 语句缺少';'在第" << tokenVec[curIndex].line -1 << "行" << endl;
            exit(0);
        }
        return 1;
    }
    return 0;
}